

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

Gia_Obj_t * Gia_ManHashAndP(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *p1_local;
  Gia_Obj_t *p0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjToLit(p,p0);
  iLit1 = Gia_ObjToLit(p,p1);
  iVar1 = Gia_ManHashAnd(p,iVar1,iLit1);
  pGVar2 = Gia_ObjFromLit(p,iVar1);
  return pGVar2;
}

Assistant:

static inline Gia_Obj_t * Gia_ManHashAndP( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )  
{ 
    return Gia_ObjFromLit( p, Gia_ManHashAnd( p, Gia_ObjToLit(p, p0), Gia_ObjToLit(p, p1) ) );
}